

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadtree.h
# Opt level: O1

Box<float> __thiscall
quadtree::
Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
::computeBox(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
             *this,Box<float> *box,int i)

{
  ulong uVar1;
  Box<float> BVar2;
  
  uVar1 = (ulong)(uint)((this->mBox).width * 0.5);
  BVar2._0_8_ = (*(code *)(&DAT_00104048 + *(int *)(&DAT_00104048 + ((ulong)box & 0xffffffff) * 4)))
                          ((this->mBox).left,uVar1,(this->mBox).height * 0.5,(this->mBox).top);
  BVar2.width = (float)(int)uVar1;
  BVar2.height = (float)(int)(uVar1 >> 0x20);
  return BVar2;
}

Assistant:

Box<Float> computeBox(const Box<Float>& box, int i) const
    {
        auto origin = box.getTopLeft();
        auto childSize = box.getSize() / static_cast<Float>(2);
        switch (i)
        {
            // North West
            case 0:
                return Box<Float>(origin, childSize);
            // Norst East
            case 1:
                return Box<Float>(Vector2<Float>(origin.x + childSize.x, origin.y), childSize);
            // South West
            case 2:
                return Box<Float>(Vector2<Float>(origin.x, origin.y + childSize.y), childSize);
            // South East
            case 3:
                return Box<Float>(origin + childSize, childSize);
            default:
                assert(false && "Invalid child index");
                return Box<Float>();
        }
    }